

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

HierarchyInstantiationSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchyInstantiationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token_const&,slang::syntax::ParameterValueAssignmentSyntax*&,std::span<slang::syntax::TokenOrSyntax,18446744073709551615ul>,slang::parsing::Token_const&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,ParameterValueAssignmentSyntax **args_2,
          span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> *args_3,Token *args_4)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  HierarchyInstantiationSyntax *pHVar1;
  __extent_storage<18446744073709551615UL> in_RSI;
  undefined8 *in_R8;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  BumpAllocator *in_stack_ffffffffffffff58;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *instances;
  ParameterValueAssignmentSyntax *parameters;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff88;
  HierarchyInstantiationSyntax *in_stack_ffffffffffffff90;
  Token in_stack_ffffffffffffff98;
  Token in_stack_ffffffffffffffb0;
  
  pHVar1 = (HierarchyInstantiationSyntax *)
           allocate(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                    (size_t)in_stack_ffffffffffffff48);
  instances = (SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)*in_R8;
  parameters = (ParameterValueAssignmentSyntax *)in_R8[1];
  elements._M_extent._M_extent_value = in_RSI._M_extent_value;
  elements._M_ptr = in_stack_ffffffffffffff48;
  slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::SeparatedSyntaxList
            (in_stack_ffffffffffffff40,elements);
  slang::syntax::HierarchyInstantiationSyntax::HierarchyInstantiationSyntax
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff98,
             parameters,instances,in_stack_ffffffffffffffb0);
  return pHVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }